

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

int json_serialize_string(char *string,size_t len,char *buf)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *string_00;
  char *buf_00;
  size_t sVar6;
  
  uVar2 = append_string(buf,"\"");
  iVar5 = -1;
  if (-1 < (int)uVar2) {
    buf_00 = buf + uVar2;
    if (buf == (char *)0x0) {
      buf_00 = (char *)0x0;
    }
    for (sVar6 = 0; len != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = string[sVar6];
      switch(cVar1) {
      case '\0':
        string_00 = "\\u0000";
        break;
      case '\x01':
        string_00 = "\\u0001";
        break;
      case '\x02':
        string_00 = "\\u0002";
        break;
      case '\x03':
        string_00 = "\\u0003";
        break;
      case '\x04':
        string_00 = "\\u0004";
        break;
      case '\x05':
        string_00 = "\\u0005";
        break;
      case '\x06':
        string_00 = "\\u0006";
        break;
      case '\a':
        string_00 = "\\u0007";
        break;
      case '\b':
        string_00 = "\\b";
        break;
      case '\t':
        string_00 = "\\t";
        break;
      case '\n':
        string_00 = "\\n";
        break;
      case '\v':
        string_00 = "\\u000b";
        break;
      case '\f':
        string_00 = "\\f";
        break;
      case '\r':
        string_00 = "\\r";
        break;
      case '\x0e':
        string_00 = "\\u000e";
        break;
      case '\x0f':
        string_00 = "\\u000f";
        break;
      case '\x10':
        string_00 = "\\u0010";
        break;
      case '\x11':
        string_00 = "\\u0011";
        break;
      case '\x12':
        string_00 = "\\u0012";
        break;
      case '\x13':
        string_00 = "\\u0013";
        break;
      case '\x14':
        string_00 = "\\u0014";
        break;
      case '\x15':
        string_00 = "\\u0015";
        break;
      case '\x16':
        string_00 = "\\u0016";
        break;
      case '\x17':
        string_00 = "\\u0017";
        break;
      case '\x18':
        string_00 = "\\u0018";
        break;
      case '\x19':
        string_00 = "\\u0019";
        break;
      case '\x1a':
        string_00 = "\\u001a";
        break;
      case '\x1b':
        string_00 = "\\u001b";
        break;
      case '\x1c':
        string_00 = "\\u001c";
        break;
      case '\x1d':
        string_00 = "\\u001d";
        break;
      case '\x1e':
        string_00 = "\\u001e";
        break;
      case '\x1f':
        string_00 = "\\u001f";
        break;
      case ' ':
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
switchD_0017002f_caseD_20:
        if (buf_00 == (char *)0x0) {
          buf_00 = (char *)0x0;
        }
        else {
          *buf_00 = cVar1;
          buf_00 = buf_00 + 1;
        }
        uVar2 = uVar2 + 1;
        goto LAB_00170200;
      case '\"':
        string_00 = "\\\"";
        break;
      case '/':
        if (parson_escape_slashes == 0) {
          string_00 = "/";
        }
        else {
          string_00 = "\\/";
        }
        break;
      default:
        if (cVar1 != '\\') goto switchD_0017002f_caseD_20;
        string_00 = "\\\\";
      }
      uVar3 = append_string(buf_00,string_00);
      if ((int)uVar3 < 0) {
        return -1;
      }
      if (buf_00 != (char *)0x0) {
        buf_00 = buf_00 + uVar3;
      }
      uVar2 = uVar2 + uVar3;
LAB_00170200:
    }
    iVar4 = append_string(buf_00,"\"");
    iVar5 = -1;
    if (-1 < iVar4) {
      iVar5 = uVar2 + iVar4;
    }
  }
  return iVar5;
}

Assistant:

static int json_serialize_string(const char *string, size_t len, char *buf) {
    size_t i = 0;
    char c = '\0';
    int written = -1, written_total = 0;
    APPEND_STRING("\"");
    for (i = 0; i < len; i++) {
        c = string[i];
        switch (c) {
            case '\"': APPEND_STRING("\\\""); break;
            case '\\': APPEND_STRING("\\\\"); break;
            case '\b': APPEND_STRING("\\b"); break;
            case '\f': APPEND_STRING("\\f"); break;
            case '\n': APPEND_STRING("\\n"); break;
            case '\r': APPEND_STRING("\\r"); break;
            case '\t': APPEND_STRING("\\t"); break;
            case '\x00': APPEND_STRING("\\u0000"); break;
            case '\x01': APPEND_STRING("\\u0001"); break;
            case '\x02': APPEND_STRING("\\u0002"); break;
            case '\x03': APPEND_STRING("\\u0003"); break;
            case '\x04': APPEND_STRING("\\u0004"); break;
            case '\x05': APPEND_STRING("\\u0005"); break;
            case '\x06': APPEND_STRING("\\u0006"); break;
            case '\x07': APPEND_STRING("\\u0007"); break;
            /* '\x08' duplicate: '\b' */
            /* '\x09' duplicate: '\t' */
            /* '\x0a' duplicate: '\n' */
            case '\x0b': APPEND_STRING("\\u000b"); break;
            /* '\x0c' duplicate: '\f' */
            /* '\x0d' duplicate: '\r' */
            case '\x0e': APPEND_STRING("\\u000e"); break;
            case '\x0f': APPEND_STRING("\\u000f"); break;
            case '\x10': APPEND_STRING("\\u0010"); break;
            case '\x11': APPEND_STRING("\\u0011"); break;
            case '\x12': APPEND_STRING("\\u0012"); break;
            case '\x13': APPEND_STRING("\\u0013"); break;
            case '\x14': APPEND_STRING("\\u0014"); break;
            case '\x15': APPEND_STRING("\\u0015"); break;
            case '\x16': APPEND_STRING("\\u0016"); break;
            case '\x17': APPEND_STRING("\\u0017"); break;
            case '\x18': APPEND_STRING("\\u0018"); break;
            case '\x19': APPEND_STRING("\\u0019"); break;
            case '\x1a': APPEND_STRING("\\u001a"); break;
            case '\x1b': APPEND_STRING("\\u001b"); break;
            case '\x1c': APPEND_STRING("\\u001c"); break;
            case '\x1d': APPEND_STRING("\\u001d"); break;
            case '\x1e': APPEND_STRING("\\u001e"); break;
            case '\x1f': APPEND_STRING("\\u001f"); break;
            case '/':
                if (parson_escape_slashes) {
                    APPEND_STRING("\\/");  /* to make json embeddable in xml\/html */
                } else {
                    APPEND_STRING("/");
                }
                break;
            default:
                if (buf != NULL) {
                    buf[0] = c;
                    buf += 1;
                }
                written_total += 1;
                break;
        }
    }
    APPEND_STRING("\"");
    return written_total;
}